

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionAccess
          (ExpressionContext *ctx,SynBase *source,FunctionLookupChain chain,ExprBase *context)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeFunctionSet *pTVar3;
  ExprFunctionAccess *this;
  SynBase *source_00;
  undefined4 extraout_var_02;
  Node *pNVar4;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<FunctionHandle> functions;
  FunctionLookupChain curr;
  FunctionLookupChain local_e0;
  SmallArray<TypeBase_*,_16U> types;
  FunctionHandle *pFVar2;
  undefined4 extraout_var_01;
  
  anon_unknown.dwarf_b837c::FunctionLookupChain::next(&curr,&chain);
  pNVar4 = chain.node.node;
  if (curr.node.node == (Node *)0x0) {
    if (context == (ExprBase *)0x0) {
      source_00 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pNVar4 = chain.node.node;
      context = CreateFunctionContextAccess
                          (ctx,source_00,*(FunctionData **)(chain.node.node + 0x10));
    }
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_02,iVar1);
    ExprFunctionAccess::ExprFunctionAccess
              (this,source,&(*(FunctionData **)(pNVar4 + 0x10))->type->super_TypeBase,
               *(FunctionData **)(pNVar4 + 0x10),context);
  }
  else {
    types.allocator = ctx->allocator;
    types.data = types.little;
    types.count = 0;
    types.max = 0x10;
    functions.head = (FunctionHandle *)0x0;
    functions.tail = (FunctionHandle *)0x0;
    local_e0.node.start = *(Node **)(*(long *)(chain.node.node + 0x10) + 0x28);
    SmallArray<TypeBase_*,_16U>::push_back(&types,(TypeBase **)&local_e0);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
    pFVar2 = (FunctionHandle *)CONCAT44(extraout_var,iVar1);
    pFVar2->function = *(FunctionData **)(pNVar4 + 0x10);
    pFVar2->next = (FunctionHandle *)0x0;
    pFVar2->listed = false;
    IntrusiveList<FunctionHandle>::push_back(&functions,pFVar2);
    while (curr.node.node != (Node *)0x0) {
      local_e0.node.start = *(Node **)(*(long *)(curr.node.node + 0x10) + 0x28);
      SmallArray<TypeBase_*,_16U>::push_back(&types,(TypeBase **)&local_e0);
      iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x18);
      pFVar2 = (FunctionHandle *)CONCAT44(extraout_var_00,iVar1);
      pFVar2->function = *(FunctionData **)(curr.node.node + 0x10);
      pFVar2->next = (FunctionHandle *)0x0;
      pFVar2->listed = false;
      IntrusiveList<FunctionHandle>::push_back(&functions,pFVar2);
      anon_unknown.dwarf_b837c::FunctionLookupChain::next(&local_e0,&curr);
      curr.node.start = local_e0.node.start;
      curr.node.node = local_e0.node.node;
    }
    setTypes.count = types.count;
    setTypes.data = types.data;
    setTypes._12_4_ = 0;
    pTVar3 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
    iVar1 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    this = (ExprFunctionAccess *)CONCAT44(extraout_var_01,iVar1);
    (this->super_ExprBase).typeID = 0x27;
    (this->super_ExprBase).source = source;
    (this->super_ExprBase).type = &pTVar3->super_TypeBase;
    (this->super_ExprBase).next = (ExprBase *)0x0;
    (this->super_ExprBase).listed = false;
    (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240e70;
    this->function = (FunctionData *)functions.head;
    this->context = (ExprBase *)functions.tail;
    this[1].super_ExprBase._vptr_ExprBase = (_func_int **)context;
    SmallArray<TypeBase_*,_16U>::~SmallArray(&types);
  }
  return &this->super_ExprBase;
}

Assistant:

ExprBase* CreateFunctionAccess(ExpressionContext &ctx, SynBase *source, FunctionLookupChain chain, ExprBase *context)
{
	if(FunctionLookupChain curr = chain.next())
	{
		SmallArray<TypeBase*, 16> types(ctx.allocator);
		IntrusiveList<FunctionHandle> functions;

		types.push_back(chain->type);
		functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*chain));

		while(curr)
		{
			types.push_back(curr->type);
			functions.push_back(new (ctx.get<FunctionHandle>()) FunctionHandle(*curr));

			curr = curr.next();
		}

		TypeFunctionSet *type = ctx.GetFunctionSetType(types);

		return new (ctx.get<ExprFunctionOverloadSet>()) ExprFunctionOverloadSet(source, type, functions, context);
	}

	if(!context)
		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), *chain);

	return new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(source, chain->type, *chain, context);
}